

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_swift_generator.cc
# Opt level: O1

void __thiscall t_swift_generator::generate_typedef(t_swift_generator *this,t_typedef *ttypedef)

{
  ostream *poVar1;
  t_type *ttype;
  string local_60;
  string local_40;
  
  t_generator::indent_abi_cxx11_(&local_40,(t_generator *)this);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&this->f_decl_,local_40._M_dataplus._M_p,local_40._M_string_length)
  ;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"public typealias ",0x11);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(ttypedef->symbolic_)._M_dataplus._M_p,
                      (ttypedef->symbolic_)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," = ",3);
  ttype = t_typedef::get_type(ttypedef);
  type_name_abi_cxx11_(&local_60,this,ttype,false,false);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,local_60._M_dataplus._M_p,local_60._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&this->f_decl_,::endl_abi_cxx11_._M_dataplus._M_p,
             ::endl_abi_cxx11_._M_string_length);
  return;
}

Assistant:

void t_swift_generator::generate_typedef(t_typedef* ttypedef) {
  f_decl_ << indent() << "public typealias " << ttypedef->get_symbolic()
          << " = " << type_name(ttypedef->get_type()) << endl;
  f_decl_ << endl;
}